

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeIntegerFormat
          (ParsedPatternInfo *this,UErrorCode *status)

{
  ParsedSubpatternInfo *pPVar1;
  short sVar2;
  bool bVar3;
  UChar32 UVar4;
  int16_t grouping3;
  int16_t grouping2;
  int16_t grouping1;
  ParsedSubpatternInfo *result;
  UErrorCode *status_local;
  ParsedPatternInfo *this_local;
  
  pPVar1 = this->currentSubpattern;
  do {
    UVar4 = ParserState::peek(&this->state);
    switch(UVar4) {
    case 0x23:
      if (0 < pPVar1->integerNumerals) {
        ParserState::toParseException(&this->state,L"# cannot follow 0 before decimal point");
        *status = U_FMT_PARSE_ERROR_START;
        return;
      }
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      pPVar1->groupingSizes = pPVar1->groupingSizes + 1;
      if (pPVar1->integerAtSigns < 1) {
        pPVar1->integerLeadingHashSigns = pPVar1->integerLeadingHashSigns + 1;
      }
      else {
        pPVar1->integerTrailingHashSigns = pPVar1->integerTrailingHashSigns + 1;
      }
      pPVar1->integerTotal = pPVar1->integerTotal + 1;
      break;
    default:
      sVar2 = (short)(pPVar1->groupingSizes >> 0x10);
      if (((short)pPVar1->groupingSizes == 0) && (sVar2 != -1)) {
        ParserState::toParseException(&this->state,L"Trailing grouping separator is invalid");
        *status = U_FMT_PARSE_ERROR_START;
      }
      else if ((sVar2 == 0) && ((short)(pPVar1->groupingSizes >> 0x20) != -1)) {
        ParserState::toParseException(&this->state,L"Grouping width of zero is invalid");
        *status = U_PATTERN_SYNTAX_ERROR;
      }
      return;
    case 0x2c:
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      pPVar1->groupingSizes = pPVar1->groupingSizes << 0x10;
      break;
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      if (0 < pPVar1->integerAtSigns) {
        ParserState::toParseException(&this->state,L"Cannot mix @ and 0");
        *status = U_FMT_PARSE_ERROR_START;
        return;
      }
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      pPVar1->groupingSizes = pPVar1->groupingSizes + 1;
      pPVar1->integerNumerals = pPVar1->integerNumerals + 1;
      pPVar1->integerTotal = pPVar1->integerTotal + 1;
      bVar3 = DecimalQuantity::isZero(&pPVar1->rounding);
      if ((!bVar3) || (UVar4 = ParserState::peek(&this->state), UVar4 != 0x30)) {
        UVar4 = ParserState::peek(&this->state);
        DecimalQuantity::appendDigit(&pPVar1->rounding,(char)UVar4 + -0x30,0,true);
      }
      break;
    case 0x40:
      if (0 < pPVar1->integerNumerals) {
        ParserState::toParseException(&this->state,L"Cannot mix 0 and @");
        *status = U_FMT_PARSE_ERROR_START;
        return;
      }
      if (0 < pPVar1->integerTrailingHashSigns) {
        ParserState::toParseException(&this->state,L"Cannot nest # inside of a run of @");
        *status = U_FMT_PARSE_ERROR_START;
        return;
      }
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      pPVar1->groupingSizes = pPVar1->groupingSizes + 1;
      pPVar1->integerAtSigns = pPVar1->integerAtSigns + 1;
      pPVar1->integerTotal = pPVar1->integerTotal + 1;
    }
    ParserState::next(&this->state);
  } while( true );
}

Assistant:

void ParsedPatternInfo::consumeIntegerFormat(UErrorCode& status) {
    // Convenience reference:
    ParsedSubpatternInfo& result = *currentSubpattern;

    while (true) {
        switch (state.peek()) {
            case u',':
                result.widthExceptAffixes += 1;
                result.groupingSizes <<= 16;
                break;

            case u'#':
                if (result.integerNumerals > 0) {
                    state.toParseException(u"# cannot follow 0 before decimal point");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                if (result.integerAtSigns > 0) {
                    result.integerTrailingHashSigns += 1;
                } else {
                    result.integerLeadingHashSigns += 1;
                }
                result.integerTotal += 1;
                break;

            case u'@':
                if (result.integerNumerals > 0) {
                    state.toParseException(u"Cannot mix 0 and @");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                if (result.integerTrailingHashSigns > 0) {
                    state.toParseException(u"Cannot nest # inside of a run of @");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                result.integerAtSigns += 1;
                result.integerTotal += 1;
                break;

            case u'0':
            case u'1':
            case u'2':
            case u'3':
            case u'4':
            case u'5':
            case u'6':
            case u'7':
            case u'8':
            case u'9':
                if (result.integerAtSigns > 0) {
                    state.toParseException(u"Cannot mix @ and 0");
                    status = U_UNEXPECTED_TOKEN;
                    return;
                }
                result.widthExceptAffixes += 1;
                result.groupingSizes += 1;
                result.integerNumerals += 1;
                result.integerTotal += 1;
                if (!result.rounding.isZero() || state.peek() != u'0') {
                    result.rounding.appendDigit(static_cast<int8_t>(state.peek() - u'0'), 0, true);
                }
                break;

            default:
                goto after_outer;
        }
        state.next(); // consume the symbol
    }

    after_outer:
    // Disallow patterns with a trailing ',' or with two ',' next to each other
    auto grouping1 = static_cast<int16_t> (result.groupingSizes & 0xffff);
    auto grouping2 = static_cast<int16_t> ((result.groupingSizes >> 16) & 0xffff);
    auto grouping3 = static_cast<int16_t> ((result.groupingSizes >> 32) & 0xffff);
    if (grouping1 == 0 && grouping2 != -1) {
        state.toParseException(u"Trailing grouping separator is invalid");
        status = U_UNEXPECTED_TOKEN;
        return;
    }
    if (grouping2 == 0 && grouping3 != -1) {
        state.toParseException(u"Grouping width of zero is invalid");
        status = U_PATTERN_SYNTAX_ERROR;
        return;
    }
}